

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O2

bool __thiscall
Memory::X64WriteBarrierCardTableManager::OnSegmentAlloc
          (X64WriteBarrierCardTableManager *this,char *segmentAddress,size_t numPages)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  bool bVar4;
  DWORD DVar5;
  undefined4 *puVar6;
  LPVOID pvVar7;
  uint uVar8;
  uint i_00;
  ulong uVar9;
  AutoCriticalSection AVar10;
  BYTE *lpAddress;
  BVIndex i;
  BVIndex i_01;
  AutoCriticalSection local_58;
  AutoCriticalSection critSec;
  AutoNestedHandledExceptionType local_44;
  BYTE *pBStack_40;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (this->_cardTable == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                       ,0x5e,"(_cardTable)","_cardTable");
    if (!bVar2) goto LAB_0069dae0;
    *puVar6 = 0;
  }
  this->_lastCommitState = CommitStateOnSegmentAlloc;
  if (segmentAddress < AutoSystemInfo::Data.super_SYSTEM_INFO.lpMaximumApplicationAddress) {
    local_58.cs = &this->_cardTableInitCriticalSection;
    CCLock::Enter(&(local_58.cs)->super_CCLock);
    pBStack_40 = (BYTE *)(segmentAddress + numPages * 0x1000);
    critSec.cs = (CriticalSection *)((ulong)segmentAddress >> 0x18);
    this->_lastSegmentAddress = segmentAddress;
    this->_lastSegmentNumPages = numPages;
    this->_lastSectionIndexStart = (ulong)critSec.cs & 0xffffffff;
    uVar8 = (uint)((ulong)(segmentAddress + numPages * 0x1000 + -1) >> 0x18);
    this->_lastSectionIndexLast =
         (ulong)(segmentAddress + numPages * 0x1000 + -1) >> 0x18 & 0xffffffff;
    uVar9 = (ulong)critSec.cs & 0xffffffff;
    do {
      bVar2 = true;
      i_01 = (BVIndex)uVar9;
      if (uVar8 < i_01) goto LAB_0069d94f;
      BVar3 = BVSparse<Memory::HeapAllocator>::Test(&committedSections,i_01);
      uVar9 = (ulong)(i_01 + 1);
    } while (BVar3 != '\0');
    this->_lastCommitState = CommitStateOnNeedCommit;
    uVar9 = (ulong)pBStack_40 >> 0xc;
    if (uVar9 < (ulong)segmentAddress >> 0xc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                         ,0x94,"(startIndex <= endIndex)","startIndex <= endIndex");
      if (!bVar4) goto LAB_0069dae0;
      *puVar6 = 0;
    }
    AVar10.cs = critSec.cs;
    lpAddress = (BYTE *)((ulong)(this->_cardTable + ((ulong)segmentAddress >> 0xc)) &
                        0xfffffffffffff000);
    pBStack_40 = (BYTE *)((ulong)(this->_cardTable + uVar9 + 0xfff) & 0xfffffffffffff000);
    this->_lastSectionStart = lpAddress;
    this->_lastSectionEnd = pBStack_40;
    pBStack_40 = pBStack_40 + -(long)lpAddress;
    if (pBStack_40 == (BYTE *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                         ,0xa1,"(commitSize > 0)","commitSize > 0");
      if (!bVar4) goto LAB_0069dae0;
      *puVar6 = 0;
    }
    if ((ulong)pBStack_40 >> 0xc != (ulong)((uVar8 - (int)AVar10.cs) + 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                         ,0xa3,"(commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1)"
                         ,"commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1");
      if (!bVar4) goto LAB_0069dae0;
      *puVar6 = 0;
    }
    pvVar7 = VirtualAlloc(lpAddress,(SIZE_T)pBStack_40,0x1000,4);
    if (pvVar7 == (LPVOID)0x0) {
      DVar5 = GetLastError();
      if (DVar5 == 0x1e7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                           ,0xac,"(::GetLastError() != 487L)",
                           "::GetLastError() != ERROR_INVALID_ADDRESS");
        if (!bVar2) goto LAB_0069dae0;
        *puVar6 = 0;
      }
      this->_lastCommitState = CommitStateFailedVirtualAlloc;
      bVar2 = false;
    }
    else {
      this->_lastCommitState = CommitStateOnSectionCommitted;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (&local_44,ExceptionType_DisableCheck);
      while (i_00 = (uint)AVar10.cs, i_00 <= uVar8) {
        BVSparse<Memory::HeapAllocator>::Set(&committedSections,i_00);
        AVar10.cs = (CriticalSection *)(ulong)(i_00 + 1);
      }
      this->_lastCommitState = CommitStateOnCommitBitSet;
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_44);
    }
LAB_0069d94f:
    AutoCriticalSection::~AutoCriticalSection(&local_58);
    return bVar2;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                     ,100,"(false)","false");
  if (bVar2) {
    *puVar6 = 0;
    this->_lastCommitState = CommitStateFailedMaxAddressExceeded;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_0069dae0:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool
X64WriteBarrierCardTableManager::OnSegmentAlloc(_In_ char* segmentAddress, size_t numPages)
{
    Assert(_cardTable);

    SetCommitState(OnSegmentAlloc);

    if (segmentAddress >= AutoSystemInfo::Data.lpMaximumApplicationAddress)
    {
        Assert(false); // How did this happen?
        SetCommitState(FailedMaxAddressExceeded);
        Js::Throw::FatalInternalError();
    }

    AutoCriticalSection critSec(&_cardTableInitCriticalSection);

    size_t  pageSize = AutoSystemInfo::PageSize;

    // First, check if the pages for this segment have already been committed
    // If they have, there is nothing for us to do here.
    void*   segmentEndAddress = segmentAddress + (numPages * pageSize);
    void*   segmentLastWritableAddress = (char*)segmentEndAddress - 1;
    BVIndex sectionStartIndex = GetSectionIndex(segmentAddress);
    BVIndex sectionLastIndex = GetSectionIndex(segmentLastWritableAddress);

#ifdef X64_WB_DIAG
    this->_lastSegmentAddress = segmentAddress;
    this->_lastSegmentNumPages = numPages;
    this->_lastSectionIndexStart = sectionStartIndex;
    this->_lastSectionIndexLast = sectionLastIndex;
#endif

    bool needCommit = false;
    for (BVIndex i = sectionStartIndex; i <= sectionLastIndex; i++)
    {
        if (!committedSections.Test(i))
        {
            needCommit = true;
            break;
        }
    }

    if (!needCommit)
    {
        // The pages for this segment have already been committed.
        // We don't need to do anything more, since write barriers can
        // already be set for writes to this segment
        return true;
    }

    SetCommitState(OnNeedCommit);

    // There are uncommitted pages in this range. We'll commit the full range
    // We might commit some pages that are already committed but that's okay
    const uintptr_t startIndex = RecyclerWriteBarrierManager::GetCardTableIndex(segmentAddress);
    const uintptr_t endIndex   = RecyclerWriteBarrierManager::GetCardTableIndex(segmentEndAddress);

    Assert(startIndex <= endIndex);

    // Section Start is the card table's starting entry aligned *down* to the page boundary
    // Section End is the card table's ending entry aligned *up* to the page boundary
    BYTE* sectionStart = (BYTE*) (((uintptr_t) &_cardTable[startIndex]) & ~(pageSize - 1));
    BYTE* sectionEnd   = (BYTE*) Math::Align<uintptr_t>((uintptr_t)&_cardTable[endIndex], pageSize);
    size_t commitSize  = (sectionEnd - sectionStart);

#ifdef X64_WB_DIAG
    _lastSectionStart = sectionStart;
    _lastSectionEnd = sectionEnd;
#endif

    Assert(commitSize > 0);
    Assert(commitSize % pageSize == 0);
    Assert(commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1);

    LPVOID ret = ::VirtualAlloc((LPVOID) sectionStart, commitSize, MEM_COMMIT, PAGE_READWRITE);
    if (!ret)
    {
        // If this is the error that occurred while trying to commit the page, this likely means
        // that the page we tried to commit is outside out reservation, which means that our reservation
        // was too small. This can happen if Windows increases the maximum process address space size
        // If this happens, X64WriteBarrierCardTableManager::Initialize will have to be updated
        Assert(::GetLastError() != ERROR_INVALID_ADDRESS);
        SetCommitState(FailedVirtualAlloc);
        return false;
    }

    SetCommitState(OnSectionCommitted);
    BVIndex sectionIndex = sectionStartIndex;

    try
    {
#ifdef EXCEPTION_CHECK
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
#endif

        for (; sectionIndex <= sectionLastIndex; sectionIndex++)
        {
            committedSections.Set(sectionIndex);
        }

        SetCommitState(OnCommitBitSet);
    }
    catch (Js::OutOfMemoryException)
    {
        SetCommitState(FailedCommitBitSet);

        // We ran out of memory allocating a node for the sparse bit vector, so clean up
        // and return false
        // Since setting sectionIndex threw the exception, we don't clear it, we clear until the index before it
        for (BVIndex i = sectionStartIndex; i < sectionIndex; i++)
        {
            BOOLEAN wasSet = committedSections.TestAndClear(i);
            Assert(wasSet == TRUE);
        }

#pragma prefast(suppress:6250, "This method decommits memory")
        BOOL result = ::VirtualFree((LPVOID)sectionStart, commitSize, MEM_DECOMMIT);
        Assert(result != 0);
        return false;
    }

    return true;
}